

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

void SSL_get0_ech_name_override(SSL *ssl,char **out_name,size_t *out_name_len)

{
  pointer pSVar1;
  pointer pEVar2;
  uchar *puVar3;
  size_t sVar4;
  SSL_HANDSHAKE *hs;
  size_t *out_name_len_local;
  char **out_name_local;
  SSL *ssl_local;
  
  pSVar1 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::get(&ssl->s3->hs);
  if ((((ssl->field_0xa4 & 1) == 0) && (pSVar1 != (pointer)0x0)) &&
     (ssl->s3->ech_status == ssl_ech_rejected)) {
    pEVar2 = std::unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter>::operator->
                       (&pSVar1->selected_ech_config);
    puVar3 = bssl::Span<const_unsigned_char>::data(&pEVar2->public_name);
    *out_name = (char *)puVar3;
    pEVar2 = std::unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter>::operator->
                       (&pSVar1->selected_ech_config);
    sVar4 = bssl::Span<const_unsigned_char>::size(&pEVar2->public_name);
    *out_name_len = sVar4;
  }
  else {
    *out_name = (char *)0x0;
    *out_name_len = 0;
  }
  return;
}

Assistant:

void SSL_get0_ech_name_override(const SSL *ssl, const char **out_name,
                                size_t *out_name_len) {
  // When ECH is rejected, we use the public name. Note that, if
  // |SSL_CTX_set_reverify_on_resume| is enabled, we reverify the certificate
  // before the 0-RTT point. If also offering ECH, we verify as if
  // ClientHelloInner was accepted and do not override. This works because, at
  // this point, |ech_status| will be |ssl_ech_none|. See the
  // ECH-Client-Reject-EarlyDataReject-OverrideNameOnRetry tests in runner.go.
  const SSL_HANDSHAKE *hs = ssl->s3->hs.get();
  if (!ssl->server && hs && ssl->s3->ech_status == ssl_ech_rejected) {
    *out_name = reinterpret_cast<const char *>(
        hs->selected_ech_config->public_name.data());
    *out_name_len = hs->selected_ech_config->public_name.size();
  } else {
    *out_name = nullptr;
    *out_name_len = 0;
  }
}